

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O3

void __thiscall
amrex::MLNodeLinOp::solutionResidual
          (MLNodeLinOp *this,int amrlev,MultiFab *resid,MultiFab *x,MultiFab *b,MultiFab *param_5)

{
  uint uVar1;
  FabArray<amrex::IArrayBox> *this_00;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  undefined4 in_register_00000034;
  long lVar8;
  long lVar9;
  bool bVar10;
  MFIter mfi;
  long local_1c0;
  Box local_16c;
  Array4<const_double> local_150;
  Array4<double> local_110;
  Array4<const_int> local_d0;
  MFIter local_90;
  
  uVar1 = (b->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp;
  (*(this->super_MLLinOp)._vptr_MLLinOp[0x45])(this,CONCAT44(in_register_00000034,amrlev),0,x,1,0,0)
  ;
  (*(this->super_MLLinOp)._vptr_MLLinOp[0x46])(this,amrlev,0,resid,x);
  this_00 = (FabArray<amrex::IArrayBox> *)
            **(undefined8 **)
              &(this->m_dirichlet_mask).
               super_vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               .
               super__Vector_base<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[amrlev].
               super_vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
               .
               super__Vector_base<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ;
  MFIter::MFIter(&local_90,(FabArrayBase *)resid,true);
  if (local_90.currentIndex < local_90.endIndex) {
    do {
      MFIter::tilebox(&local_16c,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,&resid->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_150,&b->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>(&local_d0,this_00,&local_90);
      if (0 < (int)uVar1) {
        lVar4 = (long)local_16c.smallend.vect[0] * 8;
        local_1c0 = 0;
        uVar6 = 0;
        do {
          iVar2 = local_16c.smallend.vect[2];
          if (local_16c.smallend.vect[2] <= local_16c.bigend.vect[2]) {
            do {
              if (local_16c.smallend.vect[1] <= local_16c.bigend.vect[1]) {
                lVar7 = (long)iVar2;
                lVar5 = (long)local_d0.p +
                        ((long)local_16c.smallend.vect[1] - (long)local_d0.begin.y) *
                        local_d0.jstride * 4 + (lVar7 - local_d0.begin.z) * local_d0.kstride * 4 +
                        (long)local_d0.begin.x * -4 + (long)local_16c.smallend.vect[0] * 4;
                lVar9 = (long)local_16c.smallend.vect[1];
                do {
                  if (local_16c.smallend.vect[0] <= local_16c.bigend.vect[0]) {
                    lVar3 = local_110.nstride * local_1c0 +
                            (lVar7 - local_110.begin.z) * local_110.kstride * 8 +
                            (lVar9 - local_110.begin.y) * local_110.jstride * 8 +
                            (long)local_110.begin.x * -8 + lVar4;
                    lVar8 = 0;
                    do {
                      if (*(int *)(lVar5 + lVar8 * 4) == 0) {
                        *(double *)((long)local_110.p + lVar8 * 8 + lVar3) =
                             *(double *)
                              ((long)local_150.p +
                              lVar8 * 8 +
                              local_150.nstride * local_1c0 +
                              (lVar7 - local_150.begin.z) * local_150.kstride * 8 +
                              (lVar9 - local_150.begin.y) * local_150.jstride * 8 +
                              (long)local_150.begin.x * -8 + lVar4) -
                             *(double *)((long)local_110.p + lVar8 * 8 + lVar3);
                      }
                      else {
                        *(undefined8 *)((long)local_110.p + lVar8 * 8 + lVar3) = 0;
                      }
                      lVar8 = lVar8 + 1;
                    } while ((local_16c.bigend.vect[0] - local_16c.smallend.vect[0]) + 1 !=
                             (int)lVar8);
                  }
                  lVar9 = lVar9 + 1;
                  lVar5 = lVar5 + local_d0.jstride * 4;
                } while (local_16c.bigend.vect[1] + 1 != (int)lVar9);
              }
              bVar10 = iVar2 != local_16c.bigend.vect[2];
              iVar2 = iVar2 + 1;
            } while (bVar10);
          }
          uVar6 = uVar6 + 1;
          local_1c0 = local_1c0 + 8;
        } while (uVar6 != uVar1);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLNodeLinOp::solutionResidual (int amrlev, MultiFab& resid, MultiFab& x, const MultiFab& b,
                               const MultiFab* /*crse_bcdata*/)
{
    const int mglev = 0;
    const int ncomp = b.nComp();
    apply(amrlev, mglev, resid, x, BCMode::Inhomogeneous, StateMode::Solution);

    const iMultiFab& dmsk = *m_dirichlet_mask[amrlev][0];
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(resid, TilingIfNotGPU()); mfi.isValid(); ++mfi)
    {
        const Box& bx = mfi.tilebox();
        Array4<Real> const& res = resid.array(mfi);
        Array4<Real const> const& bb = b.const_array(mfi);
        Array4<int const> const& dd = dmsk.const_array(mfi);
        AMREX_HOST_DEVICE_PARALLEL_FOR_4D ( bx, ncomp, i, j, k, n,
        {
            if (dd(i,j,k)) {
                res(i,j,k,n) = 0.0;
            } else {
                res(i,j,k,n) = bb(i,j,k,n) - res(i,j,k,n);
            }
        });
    }
}